

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall pugi::impl::anon_unknown_0::xpath_allocator::release(xpath_allocator *this)

{
  xpath_memory_block *pxVar1;
  xpath_memory_block *pxVar2;
  xpath_memory_block *pxVar3;
  
  pxVar3 = this->_root;
  if (pxVar3 != (xpath_memory_block *)0x0) {
    pxVar1 = pxVar3->next;
    while (pxVar2 = pxVar1, pxVar2 != (xpath_memory_block *)0x0) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (pxVar3);
      pxVar3 = pxVar2;
      pxVar1 = pxVar2->next;
    }
    return;
  }
  __assert_fail("cur",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                ,0x1e35,"void pugi::impl::(anonymous namespace)::xpath_allocator::release()");
}

Assistant:

void release()
		{
			xpath_memory_block* cur = _root;
			assert(cur);

			while (cur->next)
			{
				xpath_memory_block* next = cur->next;

				xml_memory::deallocate(cur);

				cur = next;
			}
		}